

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperOpFailure<unsigned_long,unsigned_int>
          (internal *this,char *expr1,char *expr2,unsigned_long *val1,uint *val2,char *op)

{
  AssertionResult *pAVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  char *local_88;
  char *local_80;
  char *local_78;
  AssertionResult local_70;
  string local_60;
  string local_40;
  
  local_88 = op;
  local_80 = expr2;
  local_78 = expr1;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_70,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x755ca4);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_88);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x736220);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  PrintToString<unsigned_long>(&local_40,val1);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_40);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<unsigned_int>(&local_60,val2);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_60);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar2.message_.ptr_ = extraout_RDX.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}